

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3CreateView(Parse *pParse,Token *pBegin,Token *pName1,Token *pName2,Select *pSelect,
                      int isTemp,int noErr)

{
  sqlite3 *db_00;
  Table *pTable;
  int iVar1;
  Select *pSVar2;
  bool bVar3;
  sqlite3 *db;
  Token *pTStack_90;
  int iDb;
  Token *pName;
  DbFixer sFix;
  Token sEnd;
  char *z;
  int n;
  Table *p;
  int isTemp_local;
  Select *pSelect_local;
  Token *pName2_local;
  Token *pName1_local;
  Token *pBegin_local;
  Parse *pParse_local;
  
  pTStack_90 = (Token *)0x0;
  db_00 = pParse->db;
  if (pParse->nVar < 1) {
    sqlite3StartTable(pParse,pName1,pName2,isTemp,1,0,noErr);
    pTable = pParse->pNewTable;
    if ((pTable == (Table *)0x0) || (pParse->nErr != 0)) {
      sqlite3SelectDelete(db_00,pSelect);
    }
    else {
      sqlite3TwoPartName(pParse,pName1,pName2,&stack0xffffffffffffff70);
      iVar1 = sqlite3SchemaToIndex(db_00,pTable->pSchema);
      iVar1 = sqlite3FixInit((DbFixer *)&pName,pParse,iVar1,"view",pTStack_90);
      if ((iVar1 == 0) || (iVar1 = sqlite3FixSelect((DbFixer *)&pName,pSelect), iVar1 == 0)) {
        pSVar2 = sqlite3SelectDup(db_00,pSelect,1);
        pTable->pSelect = pSVar2;
        sqlite3SelectDelete(db_00,pSelect);
        if (db_00->mallocFailed == '\0') {
          if ((db_00->init).busy == '\0') {
            sqlite3ViewGetColumnNames(pParse,pTable);
          }
          sFix.pName = (Token *)(pParse->sLastToken).z;
          if ((*(char *)&(sFix.pName)->z != '\0') && (*(char *)&(sFix.pName)->z != ';')) {
            sFix.pName = (Token *)((long)&(sFix.pName)->z +
                                  (*(ulong *)&(pParse->sLastToken).n & 0xffffffff));
          }
          z._4_4_ = (int)sFix.pName - (int)pBegin->z;
          while( true ) {
            bVar3 = false;
            if (0 < z._4_4_) {
              bVar3 = (""[(byte)pBegin->z[z._4_4_ + -1]] & 1) != 0;
            }
            if (!bVar3) break;
            z._4_4_ = z._4_4_ + -1;
          }
          sFix.pName = (Token *)(pBegin->z + (z._4_4_ + -1));
          sqlite3EndTable(pParse,(Token *)0x0,(Token *)&sFix.pName,(Select *)0x0);
        }
      }
      else {
        sqlite3SelectDelete(db_00,pSelect);
      }
    }
  }
  else {
    sqlite3ErrorMsg(pParse,"parameters are not allowed in views");
    sqlite3SelectDelete(db_00,pSelect);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3CreateView(
  Parse *pParse,     /* The parsing context */
  Token *pBegin,     /* The CREATE token that begins the statement */
  Token *pName1,     /* The token that holds the name of the view */
  Token *pName2,     /* The token that holds the name of the view */
  Select *pSelect,   /* A SELECT statement that will become the new view */
  int isTemp,        /* TRUE for a TEMPORARY view */
  int noErr          /* Suppress error messages if VIEW already exists */
){
  Table *p;
  int n;
  const char *z;
  Token sEnd;
  DbFixer sFix;
  Token *pName = 0;
  int iDb;
  sqlite3 *db = pParse->db;

  if( pParse->nVar>0 ){
    sqlite3ErrorMsg(pParse, "parameters are not allowed in views");
    sqlite3SelectDelete(db, pSelect);
    return;
  }
  sqlite3StartTable(pParse, pName1, pName2, isTemp, 1, 0, noErr);
  p = pParse->pNewTable;
  if( p==0 || pParse->nErr ){
    sqlite3SelectDelete(db, pSelect);
    return;
  }
  sqlite3TwoPartName(pParse, pName1, pName2, &pName);
  iDb = sqlite3SchemaToIndex(db, p->pSchema);
  if( sqlite3FixInit(&sFix, pParse, iDb, "view", pName)
    && sqlite3FixSelect(&sFix, pSelect)
  ){
    sqlite3SelectDelete(db, pSelect);
    return;
  }

  /* Make a copy of the entire SELECT statement that defines the view.
  ** This will force all the Expr.token.z values to be dynamically
  ** allocated rather than point to the input string - which means that
  ** they will persist after the current sqlite3_exec() call returns.
  */
  p->pSelect = sqlite3SelectDup(db, pSelect, EXPRDUP_REDUCE);
  sqlite3SelectDelete(db, pSelect);
  if( db->mallocFailed ){
    return;
  }
  if( !db->init.busy ){
    sqlite3ViewGetColumnNames(pParse, p);
  }

  /* Locate the end of the CREATE VIEW statement.  Make sEnd point to
  ** the end.
  */
  sEnd = pParse->sLastToken;
  if( ALWAYS(sEnd.z[0]!=0) && sEnd.z[0]!=';' ){
    sEnd.z += sEnd.n;
  }
  sEnd.n = 0;
  n = (int)(sEnd.z - pBegin->z);
  z = pBegin->z;
  while( ALWAYS(n>0) && sqlite3Isspace(z[n-1]) ){ n--; }
  sEnd.z = &z[n-1];
  sEnd.n = 1;

  /* Use sqlite3EndTable() to add the view to the SQLITE_MASTER table */
  sqlite3EndTable(pParse, 0, &sEnd, 0);
  return;
}